

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_unnest.cpp
# Opt level: O3

OperatorResultType
duckdb::PhysicalUnnest::ExecuteInternal
          (ExecutionContext *context,DataChunk *input,DataChunk *chunk,OperatorState *state_p,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *select_list,bool include_input)

{
  OperatorState *pOVar1;
  vector<duckdb::Vector,_true> *this;
  vector<unsigned_long,_true> *this_00;
  _func_int **position;
  sel_t *psVar2;
  unsigned_long *puVar3;
  value_type vVar4;
  bool bVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  _func_int **pp_Var9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  LogicalType *this_01;
  idx_t iVar13;
  Vector *other;
  reference pvVar14;
  _func_int **pp_Var15;
  undefined4 uVar16;
  _func_int **pp_Var17;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer extraout_RDX_01;
  pointer select_list_00;
  pointer extraout_RDX_02;
  pointer extraout_RDX_03;
  pointer extraout_RDX_04;
  long lVar18;
  ulong uVar19;
  size_type __n;
  ulong uVar20;
  _func_int **pp_Var21;
  ulong uVar22;
  _func_int **pp_Var23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  size_type __n_00;
  size_type sVar27;
  int iVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  undefined1 auVar35 [16];
  ulong local_d8;
  LogicalType local_60;
  LogicalType local_48;
  
  pOVar1 = state_p + 1;
  this = (vector<duckdb::Vector,_true> *)(state_p + 0x1c);
  this_00 = (vector<unsigned_long,_true> *)(state_p + 0x10);
  select_list_00 = (pointer)chunk;
  do {
    if (*(char *)&state_p[6]._vptr_OperatorState == '\x01') {
      UnnestOperatorState::PrepareInput
                ((UnnestOperatorState *)state_p,input,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)select_list_00);
    }
    position = pOVar1->_vptr_OperatorState;
    if ((_func_int **)input->count <= position) {
      pOVar1->_vptr_OperatorState = (_func_int **)0x0;
      state_p[2]._vptr_OperatorState = (_func_int **)0x0;
      *(undefined1 *)&state_p[6]._vptr_OperatorState = 1;
      return NEED_MORE_INPUT;
    }
    pp_Var9 = state_p[0x1d]._vptr_OperatorState;
    pp_Var15 = pp_Var9;
    pp_Var17 = position;
    if (pp_Var9 != state_p[0x1c]._vptr_OperatorState) {
      __n_00 = 0;
      do {
        pvVar6 = vector<unsigned_long,_true>::operator[](this_00,__n_00);
        *pvVar6 = 0;
        __n_00 = __n_00 + 1;
        pp_Var9 = state_p[0x1c]._vptr_OperatorState;
        pp_Var15 = state_p[0x1d]._vptr_OperatorState;
      } while (__n_00 < (ulong)(((long)pp_Var15 - (long)pp_Var9 >> 3) * 0x4ec4ec4ec4ec4ec5));
      pp_Var17 = pOVar1->_vptr_OperatorState;
    }
    local_d8 = 0;
    lVar25 = 0;
    auVar35 = _DAT_01d84390;
    do {
      if ((_func_int **)input->count <= pp_Var17) break;
      pp_Var21 = state_p[2]._vptr_OperatorState;
      pp_Var23 = state_p[3]._vptr_OperatorState;
      uVar26 = (long)pp_Var23[(long)pp_Var17] - (long)pp_Var21;
      if (0x800 - local_d8 < uVar26) {
        uVar26 = 0x800 - local_d8;
      }
      if ((_func_int **)pp_Var23[(long)pp_Var17] == pp_Var21) {
LAB_016d80bb:
        pp_Var17 = (_func_int **)((long)pp_Var17 + 1);
        state_p[1]._vptr_OperatorState = pp_Var17;
        state_p[2]._vptr_OperatorState = (_func_int **)0x0;
      }
      else {
        if (include_input) {
          psVar2 = ((SelectionVector *)(state_p + 7))->sel_vector;
          lVar24 = uVar26 + (uVar26 == 0);
          lVar18 = lVar24 + -1;
          auVar28._8_4_ = (int)lVar18;
          auVar28._0_8_ = lVar18;
          auVar28._12_4_ = (int)((ulong)lVar18 >> 0x20);
          auVar28 = auVar28 ^ auVar35;
          uVar19 = 0;
          auVar31 = _DAT_01d84380;
          auVar33 = _DAT_01db3e50;
          do {
            auVar32 = auVar31 ^ auVar35;
            iVar30 = auVar28._4_4_;
            uVar16 = SUB84(pp_Var17,0);
            if ((bool)(~(auVar32._4_4_ == iVar30 && auVar28._0_4_ < auVar32._0_4_ ||
                        iVar30 < auVar32._4_4_) & 1)) {
              *(undefined4 *)((long)psVar2 + uVar19 + local_d8 * 4) = uVar16;
            }
            if ((auVar32._12_4_ != auVar28._12_4_ || auVar32._8_4_ <= auVar28._8_4_) &&
                auVar32._12_4_ <= auVar28._12_4_) {
              *(undefined4 *)((long)psVar2 + uVar19 + local_d8 * 4 + 4) = uVar16;
            }
            iVar34 = SUB164(auVar33 ^ auVar35,4);
            if (iVar34 <= iVar30 &&
                (iVar34 != iVar30 || SUB164(auVar33 ^ auVar35,0) <= auVar28._0_4_)) {
              *(undefined4 *)((long)psVar2 + uVar19 + local_d8 * 4 + 8) = uVar16;
              *(undefined4 *)((long)psVar2 + uVar19 + local_d8 * 4 + 0xc) = uVar16;
            }
            lVar18 = auVar31._8_8_;
            auVar31._0_8_ = auVar31._0_8_ + 4;
            auVar31._8_8_ = lVar18 + 4;
            lVar18 = auVar33._8_8_;
            auVar33._0_8_ = auVar33._0_8_ + 4;
            auVar33._8_8_ = lVar18 + 4;
            uVar19 = uVar19 + 0x10;
          } while ((lVar24 * 4 + 0xcU & 0xfffffffffffffff0) != uVar19);
        }
        bVar5 = pp_Var15 != pp_Var9;
        pp_Var15 = pp_Var9;
        if (bVar5) {
          __n = 0;
          do {
            pvVar7 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                               ((vector<duckdb::UnifiedVectorFormat,_true> *)(state_p + 0x24),__n);
            pp_Var17 = pOVar1->_vptr_OperatorState;
            psVar2 = pvVar7->sel->sel_vector;
            if (psVar2 != (sel_t *)0x0) {
              pp_Var17 = (_func_int **)(ulong)psVar2[(long)pp_Var17];
            }
            puVar3 = (pvVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar3 == (unsigned_long *)0x0) ||
               ((puVar3[(ulong)pp_Var17 >> 6] >> ((ulong)pp_Var17 & 0x3f) & 1) != 0)) {
              iVar30 = (int)*(undefined8 *)(pvVar7->data + (long)pp_Var17 * 0x10);
              pp_Var17 = *(_func_int ***)(pvVar7->data + (long)pp_Var17 * 0x10 + 8);
            }
            else {
              iVar30 = 0;
              pp_Var17 = (_func_int **)0x0;
            }
            uVar19 = 0;
            if (state_p[2]._vptr_OperatorState <= pp_Var17) {
              uVar19 = (long)pp_Var17 - (long)state_p[2]._vptr_OperatorState;
            }
            uVar22 = uVar26;
            if (uVar19 < uVar26) {
              uVar22 = uVar19;
            }
            pvVar14 = vector<duckdb::SelectionVector,_true>::operator[]
                                ((vector<duckdb::SelectionVector,_true> *)(state_p + 10),__n);
            auVar35 = _DAT_01d84390;
            if (uVar22 != 0) {
              psVar2 = pvVar14->sel_vector;
              lVar18 = uVar22 - 1;
              auVar29._8_4_ = (int)lVar18;
              auVar29._0_8_ = lVar18;
              auVar29._12_4_ = (int)((ulong)lVar18 >> 0x20);
              iVar34 = (int)state_p[2]._vptr_OperatorState;
              uVar20 = 0;
              auVar32 = _DAT_01d84380;
              do {
                auVar31 = auVar29 ^ auVar35;
                auVar33 = auVar32 ^ auVar35;
                if ((bool)(~(auVar33._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar33._0_4_ ||
                            auVar31._4_4_ < auVar33._4_4_) & 1)) {
                  psVar2[local_d8 + uVar20] = iVar30 + iVar34 + (int)uVar20;
                }
                if ((auVar33._12_4_ != auVar31._12_4_ || auVar33._8_4_ <= auVar31._8_4_) &&
                    auVar33._12_4_ <= auVar31._12_4_) {
                  psVar2[local_d8 + uVar20 + 1] = iVar30 + iVar34 + 1 + (int)uVar20;
                }
                uVar20 = uVar20 + 2;
                lVar18 = auVar32._8_8_;
                auVar32._0_8_ = auVar32._0_8_ + 2;
                auVar32._8_8_ = lVar18 + 2;
              } while (((int)uVar22 + 1U & 0x1ffe) != uVar20);
            }
            pvVar8 = vector<duckdb::SelectionVector,_true>::operator[]
                               ((vector<duckdb::SelectionVector,_true> *)(state_p + 0xd),__n);
            if (uVar19 < uVar26) {
              lVar18 = uVar26 - uVar22;
              lVar24 = uVar22 + local_d8;
              do {
                pvVar14->sel_vector[lVar24] = 0;
                pvVar6 = vector<unsigned_long,_true>::operator[](this_00,__n);
                vVar4 = *pvVar6;
                *pvVar6 = vVar4 + 1;
                pvVar8->sel_vector[vVar4] = (sel_t)lVar24;
                lVar24 = lVar24 + 1;
                lVar18 = lVar18 + -1;
              } while (lVar18 != 0);
            }
            __n = __n + 1;
            pp_Var9 = state_p[0x1c]._vptr_OperatorState;
            pp_Var15 = state_p[0x1d]._vptr_OperatorState;
          } while (__n < (ulong)(((long)pp_Var15 - (long)pp_Var9 >> 3) * 0x4ec4ec4ec4ec4ec5));
          pp_Var17 = state_p[1]._vptr_OperatorState;
          pp_Var21 = state_p[2]._vptr_OperatorState;
          pp_Var23 = state_p[3]._vptr_OperatorState;
          auVar35 = _DAT_01d84390;
        }
        local_d8 = local_d8 + uVar26;
        state_p[2]._vptr_OperatorState = (_func_int **)((long)pp_Var21 + uVar26);
        if ((_func_int **)((long)pp_Var21 + uVar26) == (_func_int **)pp_Var23[(long)pp_Var17])
        goto LAB_016d80bb;
      }
      lVar25 = lVar25 + 1;
    } while (local_d8 < 0x800);
    chunk->count = local_d8;
    if (include_input) {
      select_list_00 =
           (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
      if ((input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish == select_list_00) {
        uVar26 = 0;
      }
      else {
        sVar27 = 0;
        do {
          pvVar10 = vector<duckdb::Vector,_true>::operator[](&chunk->data,sVar27);
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&input->data,sVar27);
          if (lVar25 == 1) {
            ConstantVector::Reference(pvVar10,pvVar11,(idx_t)position,input->count);
            select_list_00 = extraout_RDX;
          }
          else {
            Vector::Slice(pvVar10,pvVar11,(SelectionVector *)(state_p + 7),local_d8);
            select_list_00 = extraout_RDX_00;
          }
          sVar27 = sVar27 + 1;
          uVar26 = ((long)(input->data).
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(input->data).
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        } while (sVar27 < uVar26);
        pp_Var9 = state_p[0x1c]._vptr_OperatorState;
        pp_Var15 = state_p[0x1d]._vptr_OperatorState;
      }
    }
    else {
      uVar26 = 0;
      select_list_00 = (pointer)chunk;
    }
    if (pp_Var15 != pp_Var9) {
      sVar27 = 0;
      do {
        pvVar10 = vector<duckdb::Vector,_true>::operator[](this,sVar27);
        pvVar11 = vector<duckdb::Vector,_true>::operator[](&chunk->data,uVar26 + sVar27);
        pvVar12 = vector<duckdb::Vector,_true>::operator[](this,sVar27);
        LogicalType::LogicalType(&local_60,SQLNULL);
        bVar5 = LogicalType::operator==(&pvVar12->type,&local_60);
        if (bVar5) {
LAB_016d8232:
          LogicalType::~LogicalType(&local_60);
LAB_016d823c:
          Vector::SetVectorType(pvVar11,CONSTANT_VECTOR);
          ConstantVector::SetNull(pvVar11,true);
          select_list_00 = extraout_RDX_01;
        }
        else {
          pvVar12 = vector<duckdb::Vector,_true>::operator[](this,sVar27);
          this_01 = ListType::GetChildType(&pvVar12->type);
          LogicalType::LogicalType(&local_48,SQLNULL);
          bVar5 = LogicalType::operator==(this_01,&local_48);
          if (bVar5) {
            LogicalType::~LogicalType(&local_48);
            goto LAB_016d8232;
          }
          iVar13 = ListVector::GetListSize(pvVar10);
          LogicalType::~LogicalType(&local_48);
          LogicalType::~LogicalType(&local_60);
          if (iVar13 == 0) goto LAB_016d823c;
          other = ListVector::GetEntry(pvVar10);
          pvVar14 = vector<duckdb::SelectionVector,_true>::operator[]
                              ((vector<duckdb::SelectionVector,_true> *)(state_p + 10),sVar27);
          Vector::Slice(pvVar11,other,pvVar14,local_d8);
          pvVar6 = vector<unsigned_long,_true>::operator[](this_00,sVar27);
          select_list_00 = extraout_RDX_02;
          if (*pvVar6 != 0) {
            Vector::Flatten(pvVar11,local_d8);
            pvVar14 = vector<duckdb::SelectionVector,_true>::operator[]
                                ((vector<duckdb::SelectionVector,_true> *)(state_p + 0xd),sVar27);
            pvVar6 = vector<unsigned_long,_true>::operator[](this_00,sVar27);
            select_list_00 = extraout_RDX_03;
            if (*pvVar6 != 0) {
              uVar19 = 0;
              do {
                uVar22 = uVar19;
                if (pvVar14->sel_vector != (sel_t *)0x0) {
                  uVar22 = (ulong)pvVar14->sel_vector[uVar19];
                }
                FlatVector::SetNull(pvVar11,uVar22,true);
                uVar19 = uVar19 + 1;
                pvVar6 = vector<unsigned_long,_true>::operator[](this_00,sVar27);
                select_list_00 = extraout_RDX_04;
              } while (uVar19 < *pvVar6);
            }
          }
        }
        sVar27 = sVar27 + 1;
      } while (sVar27 < (ulong)(((long)state_p[0x1d]._vptr_OperatorState -
                                 (long)state_p[0x1c]._vptr_OperatorState >> 3) * 0x4ec4ec4ec4ec4ec5)
              );
    }
    if (chunk->count != 0) {
      return HAVE_MORE_OUTPUT;
    }
  } while( true );
}

Assistant:

OperatorResultType PhysicalUnnest::ExecuteInternal(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                   OperatorState &state_p,
                                                   const vector<unique_ptr<Expression>> &select_list,
                                                   bool include_input) {

	auto &state = state_p.Cast<UnnestOperatorState>();

	do {
		// prepare the input data by executing any expressions and getting the
		// UnifiedVectorFormat of each LIST vector (list_vector_data) and its child vector (list_child_data)
		if (state.first_fetch) {
			state.PrepareInput(input, select_list);
		}

		// finished with all rows of this input chunk, reset
		if (state.current_row >= input.size()) {
			state.Reset();
			return OperatorResultType::NEED_MORE_INPUT;
		}

		// we essentially create two different SelectionVectors to slice
		// one is for the input (if include_input is set)
		// the other is for the list we are unnesting
		// construct these
		idx_t result_length = 0;
		idx_t unnest_list_count = 0;
		auto initial_row = state.current_row;
		for (idx_t col_idx = 0; col_idx < state.list_data.ColumnCount(); col_idx++) {
			state.null_counts[col_idx] = 0;
		}
		while (result_length < STANDARD_VECTOR_SIZE && state.current_row < input.size()) {
			auto current_row_length = MinValue<idx_t>(STANDARD_VECTOR_SIZE - result_length,
			                                          state.unnest_lengths[state.current_row] - state.list_position);

			if (current_row_length > 0) {
				// set up the selection vectors
				if (include_input) {
					for (idx_t r = 0; r < current_row_length; r++) {
						state.input_sel.set_index(result_length + r, state.current_row);
					}
				}
				for (idx_t col_idx = 0; col_idx < state.list_data.ColumnCount(); col_idx++) {
					auto &vector_data = state.list_vector_data[col_idx];
					auto current_idx = vector_data.sel->get_index(state.current_row);
					idx_t list_length = 0;
					idx_t list_offset = 0;
					if (vector_data.validity.RowIsValid(current_idx)) {
						auto list_data = UnifiedVectorFormat::GetData<list_entry_t>(vector_data);
						auto list_entry = list_data[current_idx];
						list_length = list_entry.length;
						list_offset = list_entry.offset;
					}
					// unnest any entries we can
					idx_t unnest_length = MinValue<idx_t>(
					    list_length - MinValue<idx_t>(list_length, state.list_position), current_row_length);
					auto &unnest_sel = state.unnest_sels[col_idx];
					for (idx_t r = 0; r < unnest_length; r++) {
						unnest_sel.set_index(result_length + r, list_offset + state.list_position + r);
					}
					// for any remaining entries (if any) - set them in the null selection
					auto &null_sel = state.null_sels[col_idx];
					for (idx_t r = unnest_length; r < current_row_length; r++) {
						// we unnest the first row in the child list
						// this is chosen arbitrarily - we will override it with `NULL` afterwards
						// FIXME if the child list has a `NULL` entry we can directly unnest that and avoid having
						// to override it - this is a potential optimization we could do in the future
						unnest_sel.set_index(result_length + r, 0);
						null_sel.set_index(state.null_counts[col_idx]++, result_length + r);
					}
				}

				// move to the next row
				result_length += current_row_length;
				state.list_position += current_row_length;
			}
			unnest_list_count++;
			if (state.list_position == state.unnest_lengths[state.current_row]) {
				state.current_row++;
				state.list_position = 0;
			}
		}
		idx_t col_offset = 0;
		chunk.SetCardinality(result_length);
		if (include_input) {
			for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
				if (unnest_list_count == 1) {
					// everything belongs to the same row - we can do a constant reference
					ConstantVector::Reference(chunk.data[col_idx], input.data[col_idx], initial_row, input.size());
				} else {
					// input values come from different rows - we need to slice
					chunk.data[col_idx].Slice(input.data[col_idx], state.input_sel, result_length);
				}
			}
			col_offset = input.ColumnCount();
		}
		for (idx_t col_idx = 0; col_idx < state.list_data.ColumnCount(); col_idx++) {
			auto &list_vector = state.list_data.data[col_idx];
			auto &result_vector = chunk.data[col_offset + col_idx];
			if (state.list_data.data[col_idx].GetType() == LogicalType::SQLNULL ||
			    ListType::GetChildType(state.list_data.data[col_idx].GetType()) == LogicalType::SQLNULL ||
			    ListVector::GetListSize(list_vector) == 0) {
				// UNNEST(NULL) or UNNEST([])
				// we cannot slice empty lists - but if our child list is empty we can only return NULL anyway
				result_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(result_vector, true);
				continue;
			}
			auto &child_vector = ListVector::GetEntry(list_vector);
			result_vector.Slice(child_vector, state.unnest_sels[col_idx], result_length);
			if (state.null_counts[col_idx] > 0) {
				// we have NULL values that we need to set - flatten
				result_vector.Flatten(result_length);
				auto &null_sel = state.null_sels[col_idx];
				for (idx_t idx = 0; idx < state.null_counts[col_idx]; idx++) {
					auto null_index = null_sel.get_index(idx);
					FlatVector::SetNull(result_vector, null_index, true);
				}
			}
		}
	} while (chunk.size() == 0);
	return OperatorResultType::HAVE_MORE_OUTPUT;
}